

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>>,Eigen::Matrix<float,3,1,0,3,1>,Eigen::internal::assign_op<float,float>>
               (Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *dst,
               Matrix<float,_3,_1,_0,_3,_1> *src,assign_op<float,_float> *func)

{
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType local_38;
  DstEvaluatorType local_30;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_20;
  
  local_20.m_src = &local_38;
  local_30.
  super_unary_evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::internal::IndexBased,_float>
  .m_argImpl.super_block_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<float,_1,_3,_1,_1,_3>_>
  .m_data = (dst->m_matrix).
            super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data;
  local_20.m_dst = &local_30;
  local_38.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>)
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>)src;
  local_20.m_functor = func;
  local_20.m_dstExpr = dst;
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_3>
  ::run(&local_20);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}